

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O2

void __thiscall
JsonTest::TestResult::addFailureInfo
          (TestResult *this,char *file,uint line,char *expr,uint nestingLevel)

{
  Failure failure;
  value_type local_68;
  
  local_68.expr_._M_dataplus._M_p = (pointer)&local_68.expr_.field_2;
  local_68.expr_._M_string_length = 0;
  local_68.expr_.field_2._M_local_buf[0] = '\0';
  local_68.message_._M_dataplus._M_p = (pointer)&local_68.message_.field_2;
  local_68.message_._M_string_length = 0;
  local_68.message_.field_2._M_local_buf[0] = '\0';
  local_68.file_ = file;
  local_68.line_ = line;
  if (expr != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_68.expr_);
  }
  local_68.nestingLevel_ = nestingLevel;
  std::deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::push_back
            (&this->failures_,&local_68);
  Failure::~Failure(&local_68);
  return;
}

Assistant:

void TestResult::addFailureInfo(const char* file,
                                unsigned int line,
                                const char* expr,
                                unsigned int nestingLevel) {
  Failure failure;
  failure.file_ = file;
  failure.line_ = line;
  if (expr) {
    failure.expr_ = expr;
  }
  failure.nestingLevel_ = nestingLevel;
  failures_.push_back(failure);
}